

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall
stringToUnits_dotNotation_Test::~stringToUnits_dotNotation_Test
          (stringToUnits_dotNotation_Test *this)

{
  stringToUnits_dotNotation_Test *this_local;
  
  ~stringToUnits_dotNotation_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(stringToUnits, dotNotation)
{
    EXPECT_EQ(precise::m, unit_from_string("m.m.m/m.m", single_slash));
    EXPECT_EQ(precise::m.pow(3), unit_from_string("m.m.m/m.m"));
    EXPECT_EQ(
        precise::W / (precise::hr * precise::lb),
        unit_from_string("W/hr.lb", single_slash));
    EXPECT_EQ(
        precise::W * precise::mol / (precise::hr * precise::lb),
        unit_from_string("W.mol/hr.lb", single_slash));
}